

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::check_collapse_class
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Alloc *pAVar4;
  long lVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar6;
  byte bVar7;
  Int ent_dim;
  long lVar8;
  Int eev;
  int iVar9;
  long lVar10;
  IntIterator last;
  int size_in;
  size_t sVar11;
  uint uVar12;
  Read<signed_char> RVar13;
  Write<signed_char> cand_codes_w;
  Int eev_cd [2];
  type f;
  LOs edge_verts2verts;
  Read<signed_char> edges2class_dim;
  Read<signed_char> verts2class_dim;
  LO eev2v [2];
  Write<signed_char> local_1b8;
  int local_1a0 [2];
  string local_198;
  Alloc *local_178;
  element_type *local_170;
  Alloc *local_168;
  element_type *local_160;
  Alloc *local_158;
  element_type *local_150;
  Alloc *local_148;
  pointer local_140;
  Write<signed_char> local_138;
  Alloc *local_128;
  pointer local_120;
  Alloc *local_118;
  pointer local_110;
  Alloc *local_108;
  element_type *local_100;
  Alloc *local_f8;
  element_type *local_f0;
  Alloc *local_e8;
  element_type *local_e0;
  Alloc *local_d8;
  pointer local_d0;
  Alloc *local_c8;
  element_type *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  pointer psStack_90;
  Alloc *local_88;
  pointer psStack_80;
  Alloc *local_78;
  element_type *peStack_70;
  Alloc *local_68;
  element_type *peStack_60;
  Alloc *local_58;
  element_type *peStack_50;
  Alloc *local_48;
  pointer psStack_40;
  element_type *local_38;
  
  pAVar4 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    sVar11 = pAVar4->size;
  }
  else {
    sVar11 = (ulong)pAVar4 >> 3;
  }
  paVar3 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"class_dim","");
  ent_dim = (Int)mesh;
  Mesh::get_array<signed_char>((Mesh *)&local_a8,ent_dim,(string *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p,(ulong)(local_198.field_2._M_allocated_capacity + 1))
    ;
  }
  local_198._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_b8,ent_dim,(string *)0x1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p,(ulong)(local_198.field_2._M_allocated_capacity + 1))
    ;
  }
  Mesh::ask_verts_of((Mesh *)&local_c8,ent_dim);
  local_198._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
  size_in = (int)(sVar11 >> 2);
  Write<signed_char>::Write(&local_1b8,size_in,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p,(ulong)(local_198.field_2._M_allocated_capacity + 1))
    ;
  }
  local_128 = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_120 = (pointer)(cand_codes->write_).shared_alloc_.direct_ptr;
  local_118 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(local_118->size * 8 + 1);
    }
    else {
      local_118->use_count = local_118->use_count + 1;
    }
  }
  local_110 = (pointer)(cands2edges->write_).shared_alloc_.direct_ptr;
  local_108 = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_100 = local_c0;
  local_f8 = (Alloc *)local_a8._M_pi;
  if (((ulong)local_a8._M_pi & 7) == 0 && (Alloc *)local_a8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)((long)(local_a8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_a8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_a8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_f0 = local_a0;
  local_e8 = (Alloc *)local_b8._M_pi;
  if (((ulong)local_b8._M_pi & 7) == 0 && (Alloc *)local_b8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)((long)(local_b8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_b8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_b8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_e0 = local_b0;
  local_d8 = local_1b8.shared_alloc_.alloc;
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)((local_1b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b8.shared_alloc_.alloc)->use_count = (local_1b8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d0 = (pointer)local_1b8.shared_alloc_.direct_ptr;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_88 = local_118;
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_118->size * 8 + 1);
    }
    else {
      local_118->use_count = local_118->use_count + 1;
    }
  }
  local_78 = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  peStack_70 = local_c0;
  local_68 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  peStack_60 = local_a0;
  local_58 = local_e8;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)(local_e8->size * 8 + 1);
    }
    else {
      local_e8->use_count = local_e8->use_count + 1;
    }
  }
  peStack_50 = local_b0;
  local_48 = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  psStack_40 = (pointer)local_1b8.shared_alloc_.direct_ptr;
  psStack_90 = local_120;
  psStack_80 = local_110;
  if (0 < size_in) {
    local_198._M_dataplus._M_p = (pointer)local_98._M_pi;
    if (((ulong)local_98._M_pi & 7) == 0 && (Alloc *)local_98._M_pi != (Alloc *)0x0) {
      *(int *)&local_98._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_98._M_pi[3]._vptr__Sp_counted_base + -1;
      local_198._M_dataplus._M_p = (pointer)((long)(local_98._M_pi)->_vptr__Sp_counted_base * 8 + 1)
      ;
    }
    local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psStack_90 = (pointer)0x0;
    local_198.field_2._M_allocated_capacity = (size_type)local_88;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_198.field_2._M_allocated_capacity = local_88->size * 8 + 1;
    }
    local_88 = (Alloc *)0x0;
    psStack_80 = (pointer)0x0;
    local_178 = local_78;
    local_170 = local_c0;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_178 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    peStack_70 = (element_type *)0x0;
    local_168 = local_68;
    local_160 = local_a0;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_68->use_count = local_68->use_count + -1;
      local_168 = (Alloc *)(local_68->size * 8 + 1);
    }
    local_68 = (Alloc *)0x0;
    peStack_60 = (element_type *)0x0;
    local_158 = local_58;
    local_150 = local_b0;
    if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
      local_58->use_count = local_58->use_count + -1;
      local_158 = (Alloc *)(local_58->size * 8 + 1);
    }
    local_58 = (Alloc *)0x0;
    peStack_50 = (element_type *)0x0;
    local_148 = local_48;
    local_140 = (pointer)local_1b8.shared_alloc_.direct_ptr;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      local_48->use_count = local_48->use_count + -1;
      local_148 = (Alloc *)(local_48->size * 8 + 1);
    }
    local_48 = (Alloc *)0x0;
    psStack_40 = (pointer)0x0;
    entering_parallel = '\0';
    lVar8 = 0;
    do {
      bVar7 = *(byte *)((long)&(local_120->
                               super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
      uVar12 = (uint)(char)bVar7;
      lVar5 = (long)*(int *)((long)&(local_110->
                                    super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar8 * 4);
      local_38 = (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_c0->library_)->_M_ptr)[lVar5];
      lVar10 = 0;
      do {
        local_1a0[lVar10] =
             (int)*(char *)((long)&local_a0->library_ + (long)*(int *)((long)&local_38 + lVar10 * 4)
                           );
        lVar10 = lVar10 + 1;
      } while (lVar10 == 1);
      iVar9 = (int)*(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                      *)&local_b0->library_)->_M_ptr + lVar5);
      if (local_1a0[0] == local_1a0[1]) {
        if (local_1a0[0] != iVar9) {
          bVar7 = 0;
        }
      }
      else {
        lVar5 = 0;
        do {
          if (((uVar12 >> ((uint)lVar5 & 0x1f) & 1) != 0) && (local_1a0[lVar5] != iVar9)) {
            bVar7 = bVar7 & ~(byte)(1 << ((byte)lVar5 & 0x1f));
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 == 1);
      }
      *(byte *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                       local_1b8.shared_alloc_.direct_ptr)->_M_ptr + lVar8) = bVar7;
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != size_in);
    local_198._M_string_length = (size_type)local_120;
    local_198.field_2._8_8_ = local_110;
    check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_198);
  }
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_98);
  local_138.shared_alloc_.alloc = local_1b8.shared_alloc_.alloc;
  local_138.shared_alloc_.direct_ptr = local_1b8.shared_alloc_.direct_ptr;
  if ((((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
       local_1b8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_1b8.shared_alloc_.alloc)->use_count = (local_1b8.shared_alloc_.alloc)->use_count + -1;
    local_138.shared_alloc_.alloc = (Alloc *)((local_1b8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_1b8.shared_alloc_.alloc = (Alloc *)0x0;
  local_1b8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_138);
  pAVar4 = local_138.shared_alloc_.alloc;
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_138.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_128);
  pAVar4 = local_1b8.shared_alloc_.alloc;
  pvVar6 = extraout_RDX;
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1b8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar6 = extraout_RDX_00;
    }
  }
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    piVar1 = &local_c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8);
      operator_delete(local_c8,0x48);
      pvVar6 = extraout_RDX_01;
    }
  }
  if (((ulong)local_b8._M_pi & 7) == 0 && (Alloc *)local_b8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_b8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_b8._M_pi);
      operator_delete(local_b8._M_pi,0x48);
      pvVar6 = extraout_RDX_02;
    }
  }
  if (((ulong)local_a8._M_pi & 7) == 0 && (Alloc *)local_a8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_a8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_a8._M_pi);
      operator_delete(local_a8._M_pi,0x48);
      pvVar6 = extraout_RDX_03;
    }
  }
  RVar13.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar13.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_class(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  auto ncands = cands2edges.size();
  auto verts2class_dim = mesh->get_array<I8>(VERT, "class_dim");
  auto edges2class_dim = mesh->get_array<I8>(EDGE, "class_dim");
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto edge = cands2edges[cand];
    LO eev2v[2];
    for (Int eev = 0; eev < 2; ++eev)
      eev2v[eev] = edge_verts2verts[edge * 2 + eev];
    Int eev_cd[2];
    for (Int eev = 0; eev < 2; ++eev) eev_cd[eev] = verts2class_dim[eev2v[eev]];
    Int e_cd = edges2class_dim[edge];
    /* if both vertices are classified onto the same dimension,
       the edge must also be classified onto that dimension */
    if (eev_cd[0] == eev_cd[1]) {
      if (eev_cd[0] != e_cd) code = DONT_COLLAPSE;
    } else {
      for (Int col_v = 0; col_v < 2; ++col_v) {
        if (collapses(cand_codes[cand], col_v)) {
          /* otherwise, the vertex to collapse and the edge must
             be classified onto the same dimension */
          if (eev_cd[col_v] != e_cd) {
            code = dont_collapse(code, col_v);
          }
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_class");
  return cand_codes_w;
}